

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IPF.cpp
# Opt level: O3

shared_ptr<Storage::Disk::Track> __thiscall
Storage::Disk::IPF::get_track_at_position(IPF *this,Address address)

{
  IPF *this_00;
  uint32_t uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  _Base_ptr p_Var6;
  byte bVar7;
  byte bVar8;
  uint32_t uVar9;
  iterator iVar10;
  pointer pBVar11;
  ulong uVar12;
  pointer pBVar13;
  Time bit_length;
  long lVar14;
  ulong uVar15;
  int block;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var16;
  ulong uVar17;
  _Base_ptr __n;
  long lVar18;
  IPF *this_01;
  char *this_02;
  byte bVar19;
  _Rb_tree_color _Var20;
  _Vector_base<BlockDescriptor,_std::allocator<BlockDescriptor>_> *p_Var21;
  pointer pBVar22;
  shared_ptr<Storage::Disk::Track> sVar23;
  vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_> segments;
  pointer local_a0;
  undefined1 local_91;
  pointer local_90;
  Address local_88;
  pointer local_80;
  vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_> local_78;
  _Base_ptr local_60;
  int local_54;
  IPF *local_50;
  DiskImage local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  key_type local_38;
  
  iVar10 = std::
           _Rb_tree<Storage::Disk::Track::Address,_std::pair<const_Storage::Disk::Track::Address,_Storage::Disk::IPF::TrackDescription>,_std::_Select1st<std::pair<const_Storage::Disk::Track::Address,_Storage::Disk::IPF::TrackDescription>_>,_std::less<Storage::Disk::Track::Address>,_std::allocator<std::pair<const_Storage::Disk::Track::Address,_Storage::Disk::IPF::TrackDescription>_>_>
           ::find((_Rb_tree<Storage::Disk::Track::Address,_std::pair<const_Storage::Disk::Track::Address,_Storage::Disk::IPF::TrackDescription>,_std::_Select1st<std::pair<const_Storage::Disk::Track::Address,_Storage::Disk::IPF::TrackDescription>_>,_std::less<Storage::Disk::Track::Address>,_std::allocator<std::pair<const_Storage::Disk::Track::Address,_Storage::Disk::IPF::TrackDescription>_>_>
                   *)((long)address + 0x100),&local_38);
  if ((iVar10._M_node == (_Base_ptr)((long)address + 0x108)) ||
     (__n = iVar10._M_node[1]._M_parent, __n == (_Base_ptr)0x0)) {
    (this->super_DiskImage)._vptr_DiskImage = (_func_int **)0x0;
    (this->super_TypeDistinguisher)._vptr_TypeDistinguisher = (_func_int **)0x0;
    _Var16._M_pi = extraout_RDX;
    goto LAB_00433682;
  }
  this_00 = (IPF *)((long)address + 0x10);
  local_88 = address;
  FileHolder::seek((FileHolder *)this_00,(long)__n,0);
  p_Var21 = (_Vector_base<BlockDescriptor,_std::allocator<BlockDescriptor>_> *)
            (ulong)iVar10._M_node[2]._M_color;
  if (p_Var21 == (_Vector_base<BlockDescriptor,_std::allocator<BlockDescriptor>_> *)0x0) {
    local_90 = (pointer)0x0;
    local_a0 = (pointer)0x0;
LAB_00433626:
    local_78.
    super__Vector_base<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.
    super__Vector_base<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.
    super__Vector_base<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    pBVar11 = std::_Vector_base<BlockDescriptor,_std::allocator<BlockDescriptor>_>::_M_allocate
                        (p_Var21,(size_t)__n);
    local_90 = pBVar11 + (long)p_Var21;
    local_a0 = pBVar11;
    if (iVar10._M_node[2]._M_color == _S_red) goto LAB_00433626;
    _Var20 = _S_red;
    local_60 = iVar10._M_node;
    local_50 = this;
    do {
      if (pBVar11 == local_90) {
        uVar17 = (long)local_90 - (long)local_a0;
        if (uVar17 == 0x7ffffffffffffff8) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar12 = ((long)uVar17 >> 3) * -0x5555555555555555;
        uVar15 = uVar12;
        if (local_90 == local_a0) {
          uVar15 = 1;
        }
        p_Var21 = (_Vector_base<BlockDescriptor,_std::allocator<BlockDescriptor>_> *)
                  (uVar15 + uVar12);
        if ((_Vector_base<BlockDescriptor,_std::allocator<BlockDescriptor>_> *)0x555555555555554 <
            p_Var21) {
          p_Var21 = (_Vector_base<BlockDescriptor,_std::allocator<BlockDescriptor>_> *)
                    0x555555555555555;
        }
        if (CARRY8(uVar15,uVar12)) {
          p_Var21 = (_Vector_base<BlockDescriptor,_std::allocator<BlockDescriptor>_> *)
                    0x555555555555555;
        }
        pBVar13 = std::_Vector_base<BlockDescriptor,_std::allocator<BlockDescriptor>_>::_M_allocate
                            (p_Var21,0xaaaaaaaaaaaaaaab);
        *(undefined8 *)((long)pBVar13 + uVar17) = 0;
        ((undefined8 *)((long)pBVar13 + uVar17))[1] = 0;
        *(undefined8 *)((long)pBVar13 + uVar17 + 0x10) = 0;
        pBVar22 = pBVar13;
        for (pBVar11 = local_a0; local_90 != pBVar11; pBVar11 = pBVar11 + 1) {
          uVar9 = pBVar11->data_offset;
          pBVar22->default_gap_value = pBVar11->default_gap_value;
          pBVar22->data_offset = uVar9;
          uVar9 = pBVar11->gap_bits;
          uVar1 = pBVar11->gap_offset;
          bVar2 = pBVar11->is_mfm;
          bVar3 = pBVar11->has_forward_gap;
          bVar4 = pBVar11->has_backwards_gap;
          bVar5 = pBVar11->data_unit_is_bits;
          pBVar22->data_bits = pBVar11->data_bits;
          pBVar22->gap_bits = uVar9;
          pBVar22->gap_offset = uVar1;
          pBVar22->is_mfm = bVar2;
          pBVar22->has_forward_gap = bVar3;
          pBVar22->has_backwards_gap = bVar4;
          pBVar22->data_unit_is_bits = bVar5;
          pBVar22 = pBVar22 + 1;
        }
        if (local_a0 != (pointer)0x0) {
          operator_delete(local_a0,uVar17);
        }
        local_90 = pBVar13 + (long)p_Var21;
        local_a0 = pBVar13;
      }
      else {
        pBVar11->data_bits = 0;
        pBVar11->gap_bits = 0;
        pBVar11->gap_offset = 0;
        pBVar11->is_mfm = false;
        pBVar11->has_forward_gap = false;
        pBVar11->has_backwards_gap = false;
        pBVar11->data_unit_is_bits = false;
        pBVar11->default_gap_value = 0;
        pBVar11->data_offset = 0;
        pBVar22 = pBVar11;
      }
      uVar9 = FileHolder::get32be((FileHolder *)this_00);
      pBVar22->data_bits = uVar9;
      uVar9 = FileHolder::get32be((FileHolder *)this_00);
      pBVar22->gap_bits = uVar9;
      lVar18 = 8;
      if (*(char *)((long)local_88 + 0x130) == '\x01') {
        uVar9 = FileHolder::get32be((FileHolder *)this_00);
        pBVar22->gap_offset = uVar9;
        lVar18 = 4;
      }
      FileHolder::seek((FileHolder *)this_00,lVar18,1);
      uVar9 = FileHolder::get32be((FileHolder *)this_00);
      pBVar22->is_mfm = uVar9 == 1;
      uVar9 = FileHolder::get32be((FileHolder *)this_00);
      bVar7 = (byte)uVar9;
      pBVar22->has_forward_gap = (bool)(bVar7 & 1);
      pBVar22->has_backwards_gap = (bool)(bVar7 >> 1 & 1);
      pBVar22->data_unit_is_bits = (bool)(bVar7 >> 2 & 1);
      uVar9 = FileHolder::get32be((FileHolder *)this_00);
      pBVar22->default_gap_value = uVar9;
      this_01 = this_00;
      uVar9 = FileHolder::get32be((FileHolder *)this_00);
      pBVar11 = pBVar22 + 1;
      pBVar22->data_offset = uVar9;
      _Var20 = _Var20 + _S_black;
    } while (_Var20 < local_60[2]._M_color);
    local_78.
    super__Vector_base<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.
    super__Vector_base<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.
    super__Vector_base<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this = local_50;
    if (local_a0 != pBVar11) {
      block = 0;
      pBVar11 = local_a0;
      do {
        p_Var6 = local_60;
        local_54 = block;
        bit_length = IPF::bit_length(this_01,*(Density *)&local_60[1]._M_left,block);
        local_80 = pBVar11;
        if ((ulong)pBVar11->gap_offset == 0) {
          if ((ulong)pBVar11->gap_bits != 0) {
            add_gap(this_01,&local_78,bit_length,(ulong)pBVar11->gap_bits,pBVar11->default_gap_value
                   );
          }
        }
        else {
          FileHolder::seek((FileHolder *)this_00,
                           (long)&(p_Var6[1]._M_parent)->_M_color + (ulong)pBVar11->gap_offset,0);
          while (this_01 = this_00, bVar7 = FileHolder::get8((FileHolder *)this_00), bVar7 != 0) {
            if (bVar7 < 0x20) {
              uVar17 = 0;
            }
            else {
              bVar19 = bVar7 >> 5;
              uVar17 = 0;
              do {
                bVar8 = FileHolder::get8((FileHolder *)this_00);
                uVar17 = uVar17 << 8 | (ulong)bVar8;
                bVar19 = bVar19 - 1;
              } while (bVar19 != 0);
            }
            if ((bVar7 & 0x1f) == 1) {
              this_02 = "Adding gap length %zu bits\n";
              printf("Adding gap length %zu bits\n",uVar17);
              add_gap((IPF *)this_02,&local_78,bit_length,uVar17,local_80->default_gap_value);
            }
            else {
              printf("Adding sampled gap length %zu bits\n",uVar17);
              add_raw_data((IPF *)local_88,&local_78,bit_length,uVar17);
            }
          }
        }
        if ((ulong)local_80->data_offset != 0) {
          FileHolder::seek((FileHolder *)this_00,
                           (long)&(local_60[1]._M_parent)->_M_color + (ulong)local_80->data_offset,0
                          );
          while (this_01 = this_00, bVar7 = FileHolder::get8((FileHolder *)this_00), bVar7 != 0) {
            if (bVar7 < 0x20) {
              uVar17 = 0;
            }
            else {
              bVar19 = bVar7 >> 5;
              uVar17 = 0;
              do {
                bVar8 = FileHolder::get8((FileHolder *)this_00);
                uVar17 = uVar17 << 8 | (ulong)bVar8;
                bVar19 = bVar19 - 1;
              } while (bVar19 != 0);
            }
            uVar17 = uVar17 << (local_80->data_unit_is_bits == false) * '\x03';
            lVar18 = FileHolder::tell((FileHolder *)this_00);
            bVar7 = bVar7 & 0x1f;
            if (bVar7 - 2 < 2) {
              add_unencoded_data((IPF *)local_88,&local_78,bit_length,uVar17);
            }
            else if ((bVar7 == 1) || (bVar7 == 4)) {
              add_raw_data((IPF *)local_88,&local_78,bit_length,uVar17);
            }
            else {
              printf("Unhandled data type %d, length %zu bits\n",(ulong)bVar7,uVar17);
            }
            lVar14 = FileHolder::tell((FileHolder *)this_00);
            if (lVar14 != (uVar17 >> 3) + lVar18) {
              __assert_fail("file_.tell() == next_chunk",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Storage/Disk/DiskImage/Formats/IPF.cpp"
                            ,0x135,
                            "virtual std::shared_ptr<Track> Storage::Disk::IPF::get_track_at_position(Track::Address)"
                           );
            }
          }
        }
        block = local_54 + 1;
        pBVar11 = local_80 + 1;
        this = local_50;
      } while (local_80 != pBVar22);
    }
  }
  local_48._vptr_DiskImage = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Storage::Disk::PCMTrack,std::allocator<Storage::Disk::PCMTrack>,std::vector<Storage::Disk::PCMSegment,std::allocator<Storage::Disk::PCMSegment>>&>
            (&_Stack_40,(PCMTrack **)&local_48,(allocator<Storage::Disk::PCMTrack> *)&local_91,
             &local_78);
  (this->super_DiskImage)._vptr_DiskImage = local_48._vptr_DiskImage;
  (this->super_TypeDistinguisher)._vptr_TypeDistinguisher = (_func_int **)_Stack_40._M_pi;
  std::vector<Storage::Disk::PCMSegment,_std::allocator<Storage::Disk::PCMSegment>_>::~vector
            (&local_78);
  _Var16._M_pi = extraout_RDX_00;
  if (local_a0 != (pointer)0x0) {
    operator_delete(local_a0,(long)local_90 - (long)local_a0);
    _Var16._M_pi = extraout_RDX_01;
  }
LAB_00433682:
  sVar23.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var16._M_pi;
  sVar23.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<Storage::Disk::Track>)
         sVar23.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Track> IPF::get_track_at_position([[maybe_unused]] Track::Address address) {
	// Get the track description, if it exists, and check either that the file has contents for the track.
	auto pair = tracks_.find(address);
	if(pair == tracks_.end()) {
		return nullptr;
	}
	const TrackDescription &description = pair->second;
	if(!description.file_offset) {
		return nullptr;
	}

	// Seek to track content.
	file_.seek(description.file_offset, SEEK_SET);

	// Read the block descriptions up front.
	//
	// This is less efficient than just seeking for each block in turn,
	// but is a useful crutch to comprehension of the file format on a
	// first run through.
	struct BlockDescriptor {
		uint32_t data_bits = 0;
		uint32_t gap_bits = 0;
		uint32_t gap_offset = 0;
		bool is_mfm = false;
		bool has_forward_gap = false;
		bool has_backwards_gap = false;
		bool data_unit_is_bits = false;
		uint32_t default_gap_value = 0;
		uint32_t data_offset = 0;
	};
	std::vector<BlockDescriptor> blocks;
	blocks.reserve(description.block_count);
	for(uint32_t c = 0; c < description.block_count; c++) {
		auto &block = blocks.emplace_back();
		block.data_bits = file_.get32be();
		block.gap_bits = file_.get32be();
		if(is_sps_format_) {
			block.gap_offset = file_.get32be();
			file_.seek(4, SEEK_CUR);	// Skip 'cell type' which appears to provide no content.
		} else {
			// Skip potlower-resolution copies of data_bits and gap_bits.
			file_.seek(8, SEEK_CUR);
		}
		block.is_mfm = file_.get32be() == 1;

		const uint32_t flags = file_.get32be();
		block.has_forward_gap = flags & 1;
		block.has_backwards_gap = flags & 2;
		block.data_unit_is_bits = flags & 4;

		block.default_gap_value = file_.get32be();
		block.data_offset = file_.get32be();
	}

	std::vector<Storage::Disk::PCMSegment> segments;
	int block_count = 0;
	for(auto &block: blocks) {
		const auto length_of_a_bit = bit_length(description.density, block_count);

		if(block.gap_offset) {
			file_.seek(description.file_offset + block.gap_offset, SEEK_SET);
			while(true) {
				const uint8_t gap_header = file_.get8();
				if(!gap_header) break;

				// Decompose the header and read the length.
				enum class Type {
					None, GapLength, SampleLength
				} type = Type(gap_header & 0x1f);
				const size_t length = block_size(file_, gap_header);

				switch(type) {
					case Type::GapLength:
						printf("Adding gap length %zu bits\n", length);
						add_gap(segments, length_of_a_bit, length, block.default_gap_value);
					break;

					default:
					case Type::SampleLength:
						printf("Adding sampled gap length %zu bits\n", length);
						add_raw_data(segments, length_of_a_bit, length);
//						file_.seek(long(length >> 3), SEEK_CUR);
					break;
				}
			}
		} else if(block.gap_bits) {
			add_gap(segments, length_of_a_bit, block.gap_bits, block.default_gap_value);
		}

		if(block.data_offset) {
			file_.seek(description.file_offset + block.data_offset, SEEK_SET);
			while(true) {
				const uint8_t data_header = file_.get8();
				if(!data_header) break;

				// Decompose the header and read the length.
				enum class Type {
					None, Sync, Data, Gap, Raw, Fuzzy
				} type = Type(data_header & 0x1f);
				const size_t length = block_size(file_, data_header) * (block.data_unit_is_bits ? 1 : 8);
#ifndef NDEBUG
				const auto next_chunk = file_.tell() + long(length >> 3);
#endif

				switch(type) {
					case Type::Gap:
					case Type::Data:
						add_unencoded_data(segments, length_of_a_bit, length);
					break;

					case Type::Sync:
					case Type::Raw:
						add_raw_data(segments, length_of_a_bit, length);
					break;

					default:
						printf("Unhandled data type %d, length %zu bits\n", int(type), length);
					break;
				}

				assert(file_.tell() == next_chunk);
			}
		}

		++block_count;
	}

	return std::make_shared<Storage::Disk::PCMTrack>(segments);
}